

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O2

int mbedtls_chachapoly_finish(mbedtls_chachapoly_context *ctx,uchar *mac)

{
  int iVar1;
  uint uVar2;
  uchar len_block [16];
  
  iVar1 = ctx->state;
  if (iVar1 == 0) {
    return -0x54;
  }
  if (iVar1 == 2) {
    uVar2 = (uint)ctx->ciphertext_len & 0xf;
    if (uVar2 == 0) goto LAB_0010f706;
    len_block[8] = '\0';
    len_block[9] = '\0';
    len_block[10] = '\0';
    len_block[0xb] = '\0';
    len_block[0xc] = '\0';
    len_block[0xd] = '\0';
    len_block[0xe] = '\0';
    len_block[0] = '\0';
    len_block[1] = '\0';
    len_block[2] = '\0';
    len_block[3] = '\0';
    len_block[4] = '\0';
    len_block[5] = '\0';
    len_block[6] = '\0';
    len_block[7] = '\0';
    iVar1 = mbedtls_poly1305_update(&ctx->poly1305_ctx,len_block,(ulong)(0x10 - uVar2));
  }
  else {
    if (iVar1 != 1) goto LAB_0010f706;
    iVar1 = chachapoly_pad_aad(ctx);
  }
  if (iVar1 != 0) {
    return iVar1;
  }
LAB_0010f706:
  ctx->state = 3;
  len_block._0_7_ = (undefined7)ctx->aad_len;
  len_block[7] = (uchar)(ctx->aad_len >> 0x38);
  len_block._8_7_ = (undefined7)ctx->ciphertext_len;
  len_block[0xf] = (uchar)(ctx->ciphertext_len >> 0x38);
  iVar1 = mbedtls_poly1305_update(&ctx->poly1305_ctx,len_block,0x10);
  if (iVar1 == 0) {
    iVar1 = mbedtls_poly1305_finish(&ctx->poly1305_ctx,mac);
  }
  return iVar1;
}

Assistant:

int mbedtls_chachapoly_finish( mbedtls_chachapoly_context *ctx,
                               unsigned char mac[16] )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char len_block[16];
    CHACHAPOLY_VALIDATE_RET( ctx != NULL );
    CHACHAPOLY_VALIDATE_RET( mac != NULL );

    if( ctx->state == CHACHAPOLY_STATE_INIT )
    {
        return( MBEDTLS_ERR_CHACHAPOLY_BAD_STATE );
    }

    if( ctx->state == CHACHAPOLY_STATE_AAD )
    {
        ret = chachapoly_pad_aad( ctx );
        if( ret != 0 )
            return( ret );
    }
    else if( ctx->state == CHACHAPOLY_STATE_CIPHERTEXT )
    {
        ret = chachapoly_pad_ciphertext( ctx );
        if( ret != 0 )
            return( ret );
    }

    ctx->state = CHACHAPOLY_STATE_FINISHED;

    /* The lengths of the AAD and ciphertext are processed by
     * Poly1305 as the final 128-bit block, encoded as little-endian integers.
     */
    len_block[ 0] = (unsigned char)( ctx->aad_len       );
    len_block[ 1] = (unsigned char)( ctx->aad_len >>  8 );
    len_block[ 2] = (unsigned char)( ctx->aad_len >> 16 );
    len_block[ 3] = (unsigned char)( ctx->aad_len >> 24 );
    len_block[ 4] = (unsigned char)( ctx->aad_len >> 32 );
    len_block[ 5] = (unsigned char)( ctx->aad_len >> 40 );
    len_block[ 6] = (unsigned char)( ctx->aad_len >> 48 );
    len_block[ 7] = (unsigned char)( ctx->aad_len >> 56 );
    len_block[ 8] = (unsigned char)( ctx->ciphertext_len       );
    len_block[ 9] = (unsigned char)( ctx->ciphertext_len >>  8 );
    len_block[10] = (unsigned char)( ctx->ciphertext_len >> 16 );
    len_block[11] = (unsigned char)( ctx->ciphertext_len >> 24 );
    len_block[12] = (unsigned char)( ctx->ciphertext_len >> 32 );
    len_block[13] = (unsigned char)( ctx->ciphertext_len >> 40 );
    len_block[14] = (unsigned char)( ctx->ciphertext_len >> 48 );
    len_block[15] = (unsigned char)( ctx->ciphertext_len >> 56 );

    ret = mbedtls_poly1305_update( &ctx->poly1305_ctx, len_block, 16U );
    if( ret != 0 )
        return( ret );

    ret = mbedtls_poly1305_finish( &ctx->poly1305_ctx, mac );

    return( ret );
}